

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O1

ifstrstream * __thiscall OpenMD::ForceField::openForceFieldFile(ForceField *this,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  ifstrstream *this_00;
  long *plVar3;
  long *plVar4;
  string forceFieldFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + filename->_M_string_length);
  this_00 = (ifstrstream *)operator_new(0x278);
  ifstrstream::ifstrstream(this_00);
  ifstrstream::open(this_00,(char *)local_88[0],8,0);
  bVar2 = ifstrstream::is_open(this_00);
  if (!bVar2) {
    pcVar1 = (this->ffPath_)._M_dataplus._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + (this->ffPath_)._M_string_length);
    std::__cxx11::string::append((char *)local_68);
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)local_88[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    ifstrstream::open(this_00,(char *)local_88[0],8,0);
    bVar2 = ifstrstream::is_open(this_00);
    if (!bVar2) {
      snprintf(painCave.errMsg,2000,
               "Error opening the force field parameter file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,local_88[0]);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return this_00;
}

Assistant:

ifstrstream* ForceField::openForceFieldFile(const std::string& filename) {
    std::string forceFieldFilename(filename);

    ifstrstream* ffStream = new ifstrstream();

    // Try to open the force field file in current directory first
    ffStream->open(forceFieldFilename.c_str());

    if (!ffStream->is_open()) {
      // If current directory does not contain the force field file,
      // try to open it in ffPath_:
      forceFieldFilename = ffPath_ + "/" + forceFieldFilename;
      ffStream->open(forceFieldFilename.c_str());

      if (!ffStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the force field parameter file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 forceFieldFilename.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return ffStream;
  }